

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tearing.c
# Opt level: O0

void update_window_title(GLFWwindow *window)

{
  char *pcVar1;
  char local_118 [8];
  char title [256];
  GLFWwindow *window_local;
  
  pcVar1 = "";
  if (swap_tear != 0 && swap_interval < 0) {
    pcVar1 = " (swap tear)";
  }
  snprintf(local_118,0x100,"Tearing detector (interval %i%s, %0.1f Hz)",frame_rate,
           (ulong)(uint)swap_interval,pcVar1);
  glfwSetWindowTitle(window,local_118);
  return;
}

Assistant:

static void update_window_title(GLFWwindow* window)
{
    char title[256];

    snprintf(title, sizeof(title), "Tearing detector (interval %i%s, %0.1f Hz)",
             swap_interval,
             (swap_tear && swap_interval < 0) ? " (swap tear)" : "",
             frame_rate);

    glfwSetWindowTitle(window, title);
}